

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

void __thiscall sf2cute::SoundFont::RepairReferences(SoundFont *this,SoundFont *origin)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  __node_type *extraout_RDX;
  __node_type *extraout_RDX_00;
  __node_type *extraout_RDX_01;
  vector<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
  *__range1;
  shared_ptr<sf2cute::SFSample> *sample;
  pointer psVar4;
  shared_ptr<sf2cute::SFPreset> *preset;
  pointer psVar5;
  pointer psVar6;
  insert_iterator<std::unordered_map<std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>,_std::hash<std::shared_ptr<sf2cute::SFInstrument>_>,_std::equal_to<std::shared_ptr<sf2cute::SFInstrument>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>_>_>_>_>
  __result;
  insert_iterator<std::unordered_map<std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>,_std::hash<std::shared_ptr<sf2cute::SFSample>_>,_std::equal_to<std::shared_ptr<sf2cute::SFSample>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>_>_>_>
  iVar7;
  unordered_map<std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>,_std::hash<std::shared_ptr<sf2cute::SFSample>_>,_std::equal_to<std::shared_ptr<sf2cute::SFSample>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>_>_>
  sample_map;
  unordered_map<std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>,_std::hash<std::shared_ptr<sf2cute::SFInstrument>_>,_std::equal_to<std::shared_ptr<sf2cute::SFInstrument>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>_>_>_>
  instrument_map;
  undefined1 local_90 [64];
  undefined8 local_50;
  pointer local_48;
  pointer psStack_40;
  undefined4 local_38;
  SoundFont *local_30;
  __node_base_ptr p_Stack_28;
  _Node_iterator_base<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>,_false>
  sample_map_00;
  
  local_90._56_8_ = &p_Stack_28;
  local_50._0_2_ = kMonoSample;
  local_50._2_6_ = 0;
  local_48 = (pointer)0x0;
  psStack_40 = (pointer)0x0;
  local_38 = 0x3f800000;
  local_30 = (SoundFont *)0x0;
  p_Stack_28 = (__node_base_ptr)0x0;
  __result.iter.
  super__Node_iterator_base<std::pair<const_std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>_>,_false>
             )0x0;
  __result.container =
       (unordered_map<std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>,_std::hash<std::shared_ptr<sf2cute::SFInstrument>_>,_std::equal_to<std::shared_ptr<sf2cute::SFInstrument>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>_>_>_>
        *)(local_90 + 0x38);
  std::
  transform<__gnu_cxx::__normal_iterator<std::shared_ptr<sf2cute::SFInstrument>const*,std::vector<std::shared_ptr<sf2cute::SFInstrument>,std::allocator<std::shared_ptr<sf2cute::SFInstrument>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<sf2cute::SFInstrument>*,std::vector<std::shared_ptr<sf2cute::SFInstrument>,std::allocator<std::shared_ptr<sf2cute::SFInstrument>>>>,std::insert_iterator<std::unordered_map<std::shared_ptr<sf2cute::SFInstrument>,std::shared_ptr<sf2cute::SFInstrument>,std::hash<std::shared_ptr<sf2cute::SFInstrument>>,std::equal_to<std::shared_ptr<sf2cute::SFInstrument>>,std::allocator<std::pair<std::shared_ptr<sf2cute::SFInstrument>const,std::shared_ptr<sf2cute::SFInstrument>>>>>,std::pair<std::shared_ptr<sf2cute::SFInstrument>,std::shared_ptr<sf2cute::SFInstrument>>(*)(std::shared_ptr<sf2cute::SFInstrument>const&,std::shared_ptr<sf2cute::SFInstrument>const&)>
            ((origin->instruments_).
             super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (origin->instruments_).
             super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (this->instruments_).
             super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
             ._M_impl.super__Vector_impl_data._M_start,__result,
             std::
             make_pair<std::shared_ptr<sf2cute::SFInstrument>const&,std::shared_ptr<sf2cute::SFInstrument>const&>
            );
  local_90._0_8_ = local_90 + 0x30;
  local_90._8_8_ = 1;
  local_90._16_8_ = (_Hash_node_base *)0x0;
  local_90._24_8_ = 0;
  local_90._32_4_ = 1.0;
  local_90._40_8_ = 0;
  local_90._48_8_ = (element_type *)0x0;
  iVar7.iter.
  super__Node_iterator_base<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>,_false>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>,_false>
             )0x0;
  iVar7.container =
       (unordered_map<std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>,_std::hash<std::shared_ptr<sf2cute::SFSample>_>,_std::equal_to<std::shared_ptr<sf2cute::SFSample>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>_>_>
        *)local_90;
  iVar7 = std::
          transform<__gnu_cxx::__normal_iterator<std::shared_ptr<sf2cute::SFSample>const*,std::vector<std::shared_ptr<sf2cute::SFSample>,std::allocator<std::shared_ptr<sf2cute::SFSample>>>>,__gnu_cxx::__normal_iterator<std::shared_ptr<sf2cute::SFSample>*,std::vector<std::shared_ptr<sf2cute::SFSample>,std::allocator<std::shared_ptr<sf2cute::SFSample>>>>,std::insert_iterator<std::unordered_map<std::shared_ptr<sf2cute::SFSample>,std::shared_ptr<sf2cute::SFSample>,std::hash<std::shared_ptr<sf2cute::SFSample>>,std::equal_to<std::shared_ptr<sf2cute::SFSample>>,std::allocator<std::pair<std::shared_ptr<sf2cute::SFSample>const,std::shared_ptr<sf2cute::SFSample>>>>>,std::pair<std::shared_ptr<sf2cute::SFSample>,std::shared_ptr<sf2cute::SFSample>>(*)(std::shared_ptr<sf2cute::SFSample>const&,std::shared_ptr<sf2cute::SFSample>const&)>
                    ((origin->samples_).
                     super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (origin->samples_).
                     super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                     (this->samples_).
                     super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,iVar7,
                     std::
                     make_pair<std::shared_ptr<sf2cute::SFSample>const&,std::shared_ptr<sf2cute::SFSample>const&>
                    );
  sample_map_00._M_cur =
       (__node_type *)
       iVar7.iter.
       super__Node_iterator_base<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>,_false>
       ._M_cur;
  psVar1 = (this->presets_).
           super__Vector_base<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar5 = (this->presets_).
                super__Vector_base<std::shared_ptr<sf2cute::SFPreset>,_std::allocator<std::shared_ptr<sf2cute::SFPreset>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar1; psVar5 = psVar5 + 1) {
    RepairPresetReference
              ((psVar5->super___shared_ptr<sf2cute::SFPreset,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               (unordered_map<std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>,_std::hash<std::shared_ptr<sf2cute::SFInstrument>_>,_std::equal_to<std::shared_ptr<sf2cute::SFInstrument>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>_>_>_>
                *)(local_90 + 0x38));
    sample_map_00._M_cur = extraout_RDX;
  }
  psVar2 = (this->instruments_).
           super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->instruments_).
                super__Vector_base<std::shared_ptr<sf2cute::SFInstrument>,_std::allocator<std::shared_ptr<sf2cute::SFInstrument>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar2; psVar6 = psVar6 + 1) {
    RepairInstrumentReference
              ((psVar6->super___shared_ptr<sf2cute::SFInstrument,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,(unordered_map<std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>,_std::hash<std::shared_ptr<sf2cute::SFSample>_>,_std::equal_to<std::shared_ptr<sf2cute::SFSample>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>_>_>
                       *)local_90);
    sample_map_00._M_cur = extraout_RDX_00;
  }
  psVar3 = (this->samples_).
           super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar4 = (this->samples_).
                super__Vector_base<std::shared_ptr<sf2cute::SFSample>,_std::allocator<std::shared_ptr<sf2cute::SFSample>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar3; psVar4 = psVar4 + 1) {
    RepairSampleReference
              ((SoundFont *)
               (psVar4->super___shared_ptr<sf2cute::SFSample,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               (SFSample *)local_90,
               (unordered_map<std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>,_std::hash<std::shared_ptr<sf2cute::SFSample>_>,_std::equal_to<std::shared_ptr<sf2cute::SFSample>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>_>_>
                *)sample_map_00._M_cur);
    sample_map_00._M_cur = extraout_RDX_01;
  }
  std::
  _Hashtable<std::shared_ptr<sf2cute::SFSample>,_std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<sf2cute::SFSample>_>,_std::hash<std::shared_ptr<sf2cute::SFSample>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::shared_ptr<sf2cute::SFSample>,_std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFSample>,_std::shared_ptr<sf2cute::SFSample>_>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<sf2cute::SFSample>_>,_std::hash<std::shared_ptr<sf2cute::SFSample>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_90);
  std::
  _Hashtable<std::shared_ptr<sf2cute::SFInstrument>,_std::pair<const_std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>_>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<sf2cute::SFInstrument>_>,_std::hash<std::shared_ptr<sf2cute::SFInstrument>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::shared_ptr<sf2cute::SFInstrument>,_std::pair<const_std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>_>,_std::allocator<std::pair<const_std::shared_ptr<sf2cute::SFInstrument>,_std::shared_ptr<sf2cute::SFInstrument>_>_>,_std::__detail::_Select1st,_std::equal_to<std::shared_ptr<sf2cute::SFInstrument>_>,_std::hash<std::shared_ptr<sf2cute::SFInstrument>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)(local_90 + 0x38));
  return;
}

Assistant:

void SoundFont::RepairReferences(const SoundFont & origin) {
  // Construct a map from the original instrument to the copied instrument.
  std::unordered_map<std::shared_ptr<SFInstrument>, std::shared_ptr<SFInstrument>> instrument_map;
  std::transform(origin.instruments_.begin(), origin.instruments_.end(), instruments_.begin(),
    std::inserter(instrument_map, instrument_map.end()),
    std::make_pair<const std::shared_ptr<SFInstrument> &, const std::shared_ptr<SFInstrument> &>);

  // Construct a map from the original sample to the copied sample.
  std::unordered_map<std::shared_ptr<SFSample>, std::shared_ptr<SFSample>> sample_map;
  std::transform(origin.samples_.begin(), origin.samples_.end(), samples_.begin(),
    std::inserter(sample_map, sample_map.end()),
    std::make_pair<const std::shared_ptr<SFSample> &, const std::shared_ptr<SFSample> &>);

  // Repair presets.
  for (const auto & preset : presets_) {
    RepairPresetReference(*preset, instrument_map);
  }

  // Repair instruments.
  for (const auto & instrument : instruments_) {
    RepairInstrumentReference(*instrument, sample_map);
  }

  // Repair samples.
  for (const auto & sample : samples_) {
    RepairSampleReference(*sample, sample_map);
  }
}